

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_MuxFindPath_rec(Str_Mux_t *pMux,int *pPath,int *pnLength)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar4 = pMux->Edge[0].FanDel;
  iVar3 = pMux->Edge[1].FanDel;
  iVar1 = pMux->Edge[2].FanDel;
  iVar2 = iVar1;
  if (iVar1 < iVar3) {
    iVar2 = iVar3;
  }
  iVar6 = iVar2;
  if (iVar2 < iVar4) {
    iVar6 = iVar4;
  }
  if (iVar2 <= iVar4) {
    lVar5 = (long)pMux->Edge[0].Fan;
    if ((0 < lVar5) &&
       (iVar4 = Str_MuxFindPath_rec(pMux + (lVar5 - pMux->Id),pPath,pnLength), iVar4 == 0)) {
      return 0;
    }
    iVar3 = Abc_Var2Lit(pMux->Id,0);
    iVar4 = *pnLength;
    *pnLength = iVar4 + 1;
    pPath[iVar4] = iVar3;
    return 1;
  }
  if (iVar3 == iVar6) {
    iVar4 = Str_MuxFindPathEdge_rec(pMux,1,pPath,pnLength);
    return iVar4;
  }
  if (iVar1 != iVar6) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x657,"int Str_MuxFindPath_rec(Str_Mux_t *, int *, int *)");
  }
  return 0;
}

Assistant:

int Str_MuxFindPath_rec( Str_Mux_t * pMux, int * pPath, int * pnLength )
{
    int i, DelayMax = Abc_MaxInt( pMux->Edge[0].FanDel, Abc_MaxInt(pMux->Edge[1].FanDel, pMux->Edge[2].FanDel) );
    for ( i = 0; i < 2; i++ )
        if ( pMux->Edge[i].FanDel == DelayMax )
            return Str_MuxFindPathEdge_rec( pMux, i, pPath, pnLength );
    if ( pMux->Edge[2].FanDel == DelayMax )
        return 0;
    assert( 0 );
    return -1;
}